

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

void __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::Rips_filtration(Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                  *this,Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
                        *_dist,dimension_t _dim_max,value_t _threshold,coefficient_t _modulus)

{
  int iVar1;
  uint uVar2;
  pointer pfVar3;
  pointer ppfVar4;
  uint uVar5;
  overflow_error *this_00;
  int iVar6;
  undefined7 in_register_00000011;
  vertex_t n;
  
  pfVar3 = (_dist->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->dist).distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start =
       (_dist->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->dist).distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = pfVar3;
  (this->dist).distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (_dist->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (_dist->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (_dist->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (_dist->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppfVar4 = (_dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (this->dist).rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (_dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->dist).rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppfVar4;
  (this->dist).rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (_dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (_dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (_dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (_dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  n = (vertex_t)
      ((ulong)((long)(this->dist).rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl
                     .super__Vector_impl_data._M_finish -
              (long)(this->dist).rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                    super__Vector_impl_data._M_start) >> 3);
  this->n = n;
  if (n + -2 < (int)CONCAT71(in_register_00000011,_dim_max)) {
    _dim_max = (dimension_t)(n + -2);
  }
  this->dim_max = _dim_max;
  this->threshold = _threshold;
  this->modulus = _modulus;
  Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::Cns_encoding
            (&this->simplex_encoding,n,_dim_max + '\x02');
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar1 = (this->simplex_encoding).extra_bits;
  uVar5 = this->modulus - 2;
  uVar2 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  iVar6 = (uVar2 ^ 0xffffffe0) + 0x21;
  if (uVar5 == 0) {
    iVar6 = 0;
  }
  this->bits_for_coeff = iVar6;
  if (iVar6 <= iVar1) {
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error
            (this_00,"Not enough spare bits in the simplex encoding to store a coefficient");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

Rips_filtration(DistanceMatrix&& _dist, dimension_t _dim_max, value_t _threshold, coefficient_t _modulus)
    : dist(std::move(_dist)), n(dist.size()),
    dim_max(std::min<vertex_t>(_dim_max, dist.size() - 2)), threshold(_threshold),
    modulus(_modulus), simplex_encoding(n, dim_max + 2), bits_for_coeff(log2up(modulus-1)) {
      // See entry_with_coeff_t for the logic for log2up(modulus-1) (storing coeff-1)
      if (use_coefficients && simplex_encoding.num_extra_bits() < num_bits_for_coeff())
        // TODO: include relevant numbers in the message
        throw std::overflow_error("Not enough spare bits in the simplex encoding to store a coefficient");
    }